

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O3

int Abc_NtkDontCareWinAddMissing(Odc_Man_t *p)

{
  ulong uVar1;
  undefined4 uVar2;
  Abc_Ntk_t *pAVar3;
  long lVar4;
  int iVar5;
  int *__s;
  Vec_Ptr_t *pVVar6;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  long lVar7;
  int iVar8;
  
  pAVar3 = p->pNode->pNtk;
  if ((pAVar3->vTravIds).pArray == (int *)0x0) {
    iVar5 = pAVar3->vObjs->nSize;
    uVar1 = (long)iVar5 + 500;
    iVar8 = (int)uVar1;
    if ((pAVar3->vTravIds).nCap < iVar8) {
      __s = (int *)malloc(uVar1 * 4);
      (pAVar3->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar3->vTravIds).nCap = iVar8;
      in_RDX = extraout_RDX;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar5) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
      in_RDX = extraout_RDX_00;
    }
    (pAVar3->vTravIds).nSize = iVar8;
  }
  iVar5 = pAVar3->nTravIds;
  pAVar3->nTravIds = iVar5 + 1;
  if (iVar5 < 0x3fffffff) {
    pVVar6 = p->vLeaves;
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        lVar4 = *pVVar6->pArray[lVar7];
        iVar5 = (int)*(long *)((long)pVVar6->pArray[lVar7] + 0x10);
        uVar2 = *(undefined4 *)(lVar4 + 0xd8);
        Vec_IntFillExtra((Vec_Int_t *)(lVar4 + 0xe0),iVar5 + 1,(int)in_RDX);
        if (((long)iVar5 < 0) || (*(int *)(lVar4 + 0xe4) <= iVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)(*(long *)(lVar4 + 0xe8) + (long)iVar5 * 4) = uVar2;
        lVar7 = lVar7 + 1;
        pVVar6 = p->vLeaves;
        in_RDX = extraout_RDX_01;
      } while (lVar7 < pVVar6->nSize);
    }
    p->vBranches->nSize = 0;
    pVVar6 = p->vRoots;
    if (0 < pVVar6->nSize) {
      lVar7 = 0;
      do {
        iVar5 = Abc_NtkDontCareWinAddMissing_rec(p,(Abc_Obj_t *)pVVar6->pArray[lVar7]);
        if (iVar5 == 0) {
          return 0;
        }
        lVar7 = lVar7 + 1;
        pVVar6 = p->vRoots;
      } while (lVar7 < pVVar6->nSize);
    }
    return 1;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkDontCareWinAddMissing( Odc_Man_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    // set the leaves
    Abc_NtkIncrementTravId( p->pNode->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );        
    // explore from the roots
    Vec_PtrClear( p->vBranches );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        if ( !Abc_NtkDontCareWinAddMissing_rec( p, pObj ) )
            return 0;
    return 1;
}